

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O0

void __thiscall stackjit::ClassMetadata::insertField(ClassMetadata *this,string *name,Field *field)

{
  size_type sVar1;
  runtime_error *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>
  local_e8;
  undefined1 local_ad;
  char local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  Field *local_20;
  Field *field_local;
  string *name_local;
  ClassMetadata *this_local;
  
  local_20 = field;
  field_local = (Field *)name;
  name_local = &this->mName;
  sVar1 = std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>_>
          ::count(&this->mFields,name);
  if (sVar1 != 0) {
    local_ad = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "The field \'");
    std::operator+(local_80,local_a0);
    std::operator+(local_60,local_80);
    std::operator+(local_40,(char *)local_60);
    std::runtime_error::runtime_error(this_00,(string *)local_40);
    local_ad = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field,_true>
            (&local_e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field_local,
             local_20);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>_>_>
  ::insert(&this->mFields,&local_e8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_stackjit::Field>
  ::~pair(&local_e8);
  return;
}

Assistant:

void ClassMetadata::insertField(const std::string& name, const Field& field) {
		if (mFields.count(name) > 0) {
			throw std::runtime_error("The field '" + name + "' is already defined in the class '" + mName + "'.");
		}

		mFields.insert({ name, field });
	}